

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

IndexPair __thiscall
slang::IntervalMap<int,int,0u>::
modifyRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>,slang::IntervalMapDetails::BranchNode<int,12u,false>,false>
          (IntervalMap<int,_int,_0U> *this,BranchNode<int,_12U,_true> *rootNode,uint32_t position,
          allocator_type *alloc)

{
  uint32_t count;
  NodeImpl<int,_slang::IntervalMapDetails::BranchNode<int,_12U,_false>_> *pNVar1;
  NodeBase<slang::IntervalMapDetails::NodeRef,slang::IntervalMapDetails::interval<int>,12u> *this_00
  ;
  interval<int> iVar2;
  interval<int> *piVar3;
  NodeRef *pNVar4;
  NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
  *in_RSI;
  PoolAllocator<char,_192UL,_64UL> *in_RDI;
  uint32_t i_1;
  uint32_t size;
  BranchNode<int,_12U,_false> *newNode;
  uint32_t i;
  NodeRef nodes [2];
  uint32_t pos;
  uint32_t sizes [2];
  uint32_t NumNodes;
  IndexPair newOffset;
  BranchNode<int,_12U,_false> *in_stack_ffffffffffffff58;
  NodeRef *in_stack_ffffffffffffff60;
  uint32_t *in_stack_ffffffffffffff78;
  NodeImpl<int,_slang::IntervalMapDetails::BranchNode<int,_12U,_false>_> *this_01;
  undefined8 in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  uint local_6c;
  undefined8 local_68;
  uint local_4c;
  NodeImpl<int,_slang::IntervalMapDetails::BranchNode<int,_12U,_false>_> local_48 [16];
  uint32_t local_38;
  uint32_t local_34 [7];
  NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
  *local_18;
  IndexPair local_8;
  
  local_34[2] = 2;
  local_18 = in_RSI;
  local_8 = IntervalMapDetails::distribute
                      (in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                       (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       in_stack_ffffffffffffff78,(uint32_t)((ulong)in_RDI >> 0x20));
  local_38 = 0;
  pNVar1 = local_48;
  this_01 = (NodeImpl<int,_slang::IntervalMapDetails::BranchNode<int,_12U,_false>_> *)&local_38;
  do {
    IntervalMapDetails::NodeRef::NodeRef((NodeRef *)0x8268e2);
    pNVar1 = pNVar1 + 8;
  } while (pNVar1 != this_01);
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    this_00 = (NodeBase<slang::IntervalMapDetails::NodeRef,slang::IntervalMapDetails::interval<int>,12u>
               *)PoolAllocator<char,192ul,64ul>::
                 emplace<slang::IntervalMapDetails::BranchNode<int,12u,false>>(in_RDI);
    count = local_34[local_4c];
    IntervalMapDetails::
    NodeBase<slang::IntervalMapDetails::NodeRef,slang::IntervalMapDetails::interval<int>,12u>::
    copy<12u>(this_00,local_18,local_38,0,count);
    IntervalMapDetails::NodeRef::NodeRef<slang::IntervalMapDetails::BranchNode<int,12u,false>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
    *(undefined8 *)(local_48 + (ulong)local_4c * 8) = local_68;
    local_38 = count + local_38;
  }
  for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
    IntervalMapDetails::NodeRef::get<slang::IntervalMapDetails::BranchNode<int,12u,false>>
              (in_stack_ffffffffffffff60);
    iVar2 = IntervalMapDetails::
            NodeImpl<int,_slang::IntervalMapDetails::BranchNode<int,_12U,_false>_>::getBounds
                      (this_01,(uint32_t)((ulong)in_RDI >> 0x20));
    piVar3 = IntervalMapDetails::BranchNode<int,_12U,_true>::keyAt
                       ((BranchNode<int,_12U,_true> *)in_RDI,local_6c);
    *piVar3 = iVar2;
    in_stack_ffffffffffffff60 = (NodeRef *)(ulong)local_6c;
    pNVar4 = IntervalMapDetails::BranchNode<int,_12U,_true>::childAt
                       ((BranchNode<int,_12U,_true> *)in_RDI,local_6c);
    (pNVar4->pip).value = *(uintptr_t *)&local_48[(long)in_stack_ffffffffffffff60 * 8].field_0x0;
  }
  *(undefined4 *)((long)&in_RDI[0xc].alloc + 4) = 2;
  *(int *)&in_RDI[0xc].alloc = *(int *)&in_RDI[0xc].alloc + 1;
  return local_8;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}